

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void * Sat_ProofCore(sat_solver2 *s)

{
  int iVar1;
  Prf_Man_t *p;
  Vec_Wrd_t *pVVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  word *pwVar7;
  uint Entry;
  Vec_Int_t *p_01;
  double dVar8;
  double dVar9;
  
  if (s->pPrf1 != (Vec_Set_t *)0x0) {
    pvVar5 = Proof_DeriveCore(s->pPrf1,s->hProofLast);
    return pvVar5;
  }
  p = s->pPrf2;
  if (p == (Prf_Man_t *)0x0) {
    p_00 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar2 = p->vInfo;
    dVar9 = 0.0;
    dVar8 = 0.0;
    if (pVVar2 != (Vec_Wrd_t *)0x0) {
      dVar8 = (double)pVVar2->nCap * 8.0 + 16.0;
    }
    if (p->vSaved != (Vec_Int_t *)0x0) {
      dVar9 = (double)p->vSaved->nCap * 4.0 + 16.0;
    }
    dVar9 = dVar8 + dVar9 + 48.0;
    dVar8 = s->dPrfMemory;
    if (s->dPrfMemory <= dVar9) {
      dVar8 = dVar9;
    }
    s->dPrfMemory = dVar8;
    if (p->iFirst < 0) {
      __assert_fail("p->iFirst >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x123,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    if (p->pInfo != (word *)0x0) {
      __assert_fail("p->pInfo == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x124,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    iVar1 = p->nWords;
    iVar3 = pVVar2->nSize / iVar1;
    if (iVar3 < 1) {
      __assert_fail("Prf_ManSize(p) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                    ,0x125,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
    }
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nSize = 0;
    p_00->nCap = iVar1 << 6;
    piVar6 = (int *)malloc((long)iVar1 << 8);
    p_00->pArray = piVar6;
    pwVar7 = Prf_ManClauseInfo(p,iVar3 + -1);
    p->pInfo = pwVar7;
    p_01 = p->vId2Pr;
    Entry = 0;
    if (p_01 == (Vec_Int_t *)0x0) {
      for (; (int)Entry < p->nWords * 0x40; Entry = Entry + 1) {
        if ((*(uint *)((long)p->pInfo + (ulong)(Entry >> 5) * 4) >> (Entry & 0x1f) & 1) != 0) {
          Vec_IntPush(p_00,Entry);
        }
      }
    }
    else {
      for (; (int)Entry < p_01->nSize; Entry = Entry + 1) {
        uVar4 = Vec_IntEntry(p_01,Entry);
        if (-1 < (int)uVar4) {
          if (p->nWords * 0x40 <= (int)uVar4) {
            __assert_fail("Entry < 64 * p->nWords",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0x134,"Vec_Int_t *Prf_ManUnsatCore(Prf_Man_t *)");
          }
          if ((*(uint *)((long)p->pInfo + (ulong)(uVar4 >> 5) * 4) >> (uVar4 & 0x1f) & 1) != 0) {
            Vec_IntPush(p_00,Entry);
          }
        }
        p_01 = p->vId2Pr;
      }
    }
    p->pInfo = (word *)0x0;
    qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare2);
  }
  return p_00;
}

Assistant:

void * Sat_ProofCore( sat_solver2 * s )
{
    extern void * Proof_DeriveCore( Vec_Set_t * vProof, int hRoot );
    if ( s->pPrf1 )
        return Proof_DeriveCore( s->pPrf1, s->hProofLast );
    if ( s->pPrf2 )
    {
        s->dPrfMemory = Abc_MaxDouble( s->dPrfMemory, Prf_ManMemory(s->pPrf2) );
        return Prf_ManUnsatCore( s->pPrf2 );
    }
    return NULL;
}